

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageDataOperations.h
# Opt level: O0

void __thiscall
fe::operations::op_blend_subtract::operator()
          (op_blend_subtract *this,PixelA8 *srcPixelFormat,PixelDISTANCE *destPixelFormat,
          uchar *srcData,uchar *destData,int x,int y)

{
  int *piVar1;
  int local_60 [3];
  int local_54;
  int local_50 [3];
  int local_44;
  float local_40;
  anon_union_4_3_3c41bd51_for_Pixel_0 local_3c;
  float k;
  Pixel pD;
  Pixel pS;
  int x_local;
  uchar *destData_local;
  uchar *srcData_local;
  PixelDISTANCE *destPixelFormat_local;
  PixelA8 *srcPixelFormat_local;
  op_blend_subtract *this_local;
  
  pD.field_0 = (anon_union_4_3_3c41bd51_for_Pixel_0)x;
  PixelA8::getPixel(srcPixelFormat,srcData,(Pixel *)&k,x,y);
  PixelDISTANCE::getPixel(destPixelFormat,destData,(Pixel *)&local_3c.field_0,(int)pD.field_0,y);
  local_40 = (float)k._3_1_ / (float)local_3c._3_1_;
  local_44 = 0;
  local_50[2] = (int)(-(float)local_3c._0_1_ * local_40 + (float)local_3c._0_1_);
  piVar1 = std::max<int>(&local_44,local_50 + 2);
  local_3c.field_0.bytes[0] = (uchar)*piVar1;
  local_50[1] = 0;
  local_50[0] = (int)(-(float)local_3c._1_1_ * local_40 + (float)local_3c._1_1_);
  piVar1 = std::max<int>(local_50 + 1,local_50);
  local_3c.field_0.bytes[1] = (uchar)*piVar1;
  local_54 = 0;
  local_60[2] = (int)(-(float)local_3c._2_1_ * local_40 + (float)local_3c._2_1_);
  piVar1 = std::max<int>(&local_54,local_60 + 2);
  local_3c.field_0.bytes[2] = (uchar)*piVar1;
  local_60[1] = 0;
  local_60[0] = (uint)local_3c.field_0.bytes[3] - (uint)k._3_1_;
  piVar1 = std::max<int>(local_60 + 1,local_60);
  local_3c.field_0.bytes[3] = (uchar)*piVar1;
  PixelDISTANCE::setPixel(destPixelFormat,destData,(Pixel *)&local_3c.field_0);
  return;
}

Assistant:

void operator()(const Src& srcPixelFormat, Dest& destPixelFormat, const unsigned char* srcData, unsigned char* destData, OPERATOR_ARGS) const
            {
                Pixel pS;
                srcPixelFormat.getPixel(srcData, pS, OPERATOR_ARGS_PASS);

                Pixel pD;
                destPixelFormat.getPixel(destData, pD, OPERATOR_ARGS_PASS);

                float k = pS.a / float(pD.a);
                pD.r = std::max(0, int(pD.r - pD.r * k));
                pD.g = std::max(0, int(pD.g - pD.g * k));
                pD.b = std::max(0, int(pD.b - pD.b * k));
                pD.a = std::max(0, int(pD.a - pS.a));

                destPixelFormat.setPixel(destData, pD);
            }